

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void clear_vec_high(DisasContext_conflict1 *s,_Bool is_q,int rd)

{
  uint uVar1;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 arg1;
  uint32_t oprsz;
  undefined7 in_register_00000031;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = s->sve_len;
  if ((int)CONCAT71(in_register_00000031,is_q) == 0) {
    arg1 = tcg_const_i64_aarch64(tcg_ctx,0);
    tcg_gen_st_i64_aarch64(tcg_ctx,arg1,tcg_ctx->cpu_env,(ulong)(rd * 0x100 + 0xc18));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg1 + (long)tcg_ctx));
  }
  if (0x10 < uVar1) {
    oprsz = uVar1 - 0x10;
    tcg_gen_gvec_dup8i_aarch64(tcg_ctx,rd * 0x100 + 0xc20,oprsz,oprsz,'\0');
    return;
  }
  return;
}

Assistant:

static void clear_vec_high(DisasContext *s, bool is_q, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned ofs = fp_reg_offset(s, rd, MO_64);
    unsigned vsz = vec_full_reg_size(s);

    if (!is_q) {
        TCGv_i64 tcg_zero = tcg_const_i64(tcg_ctx, 0);
        tcg_gen_st_i64(tcg_ctx, tcg_zero, tcg_ctx->cpu_env, ofs + 8);
        tcg_temp_free_i64(tcg_ctx, tcg_zero);
    }
    if (vsz > 16) {
        tcg_gen_gvec_dup8i(tcg_ctx, ofs + 16, vsz - 16, vsz - 16, 0);
    }
}